

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::StringMakerBase<true>::convert<std::basic_string_view<char,std::char_traits<char>>>
          (String *__return_storage_ptr__,StringMakerBase<true> *this,
          basic_string_view<char,_std::char_traits<char>_> *in)

{
  ostream *stream;
  
  stream = tlssPush();
  filldata<std::basic_string_view<char,_std::char_traits<char>_>_>::fill
            (stream,(basic_string_view<char,_std::char_traits<char>_> *)this);
  tlssPop();
  return __return_storage_ptr__;
}

Assistant:

static String convert(const DOCTEST_REF_WRAP(T) in) {
                /* When parameter "in" is a null terminated const char* it works.
                 * When parameter "in" is a T arr[N] without '\0' we can fill the
                 * stringstream with N objects (T=char).If in is char pointer *
                 * without '\0' , it would cause segfault
                 * stepping over unaccessible memory.
                 */

                std::ostream* stream = tlssPush();
                filloss(stream, in);
                return tlssPop();
            }